

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  ImDrawCmd *curr_cmd;
  ImDrawList *this_local;
  
  this->_VtxCurrentIdx = 0;
  pIVar1 = (this->CmdBuffer).Data;
  iVar2 = (this->CmdBuffer).Size + -1;
  if (pIVar1[iVar2].ElemCount == 0) {
    if (pIVar1[iVar2].UserCallback != (ImDrawCallback)0x0) {
      __assert_fail("curr_cmd->UserCallback == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x239,"void ImDrawList::_OnChangedVtxOffset()");
    }
    pIVar1[iVar2].VtxOffset = (this->_CmdHeader).VtxOffset;
  }
  else {
    AddDrawCmd(this);
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}